

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::UnescapeCEscapeSequences
              (char *source,char *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  uint uVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  LogMessage *pLVar6;
  byte *pbVar7;
  byte bVar8;
  byte *pbVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  pbVar9 = (byte *)dest;
  if (errors != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/strutil.cc"
               ,0x131);
    pLVar6 = internal::LogMessage::operator<<(&local_60,"CHECK failed: errors == NULL: ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,"Error reporting not implemented.");
    internal::LogFinisher::operator=(&local_61,pLVar6);
    internal::LogMessage::~LogMessage(&local_60);
  }
  for (; (((byte *)source == pbVar9 && (*source != 0)) && (*source != 0x5c));
      source = (char *)((byte *)source + 1)) {
    pbVar9 = pbVar9 + 1;
  }
  do {
    bVar8 = *source;
    if (bVar8 != 0x5c) {
      pbVar7 = (byte *)source;
      if (bVar8 != 0) goto LAB_0021c8b4;
LAB_0021c8d6:
      *pbVar9 = 0;
      return (int)pbVar9 - (int)dest;
    }
    pbVar7 = (byte *)source + 1;
    bVar8 = ((byte *)source)[1];
    uVar1 = (uint)bVar8;
    if (uVar1 - 0x30 < 8) {
      bVar2 = bVar8 - 0x30;
      pbVar3 = pbVar7;
      if ((((byte *)source)[2] & 0xf8) == 0x30) {
        bVar2 = ((bVar8 - 0x30) * '\b' + ((byte *)source)[2]) - 0x30;
        pbVar3 = (byte *)source + 2;
      }
      pbVar7 = pbVar3 + 1;
      bVar8 = (bVar2 * '\b' + pbVar3[1]) - 0x30;
      if ((pbVar3[1] & 0xf8) != 0x30) {
        pbVar7 = pbVar3;
        bVar8 = bVar2;
      }
      goto LAB_0021c8b4;
    }
    switch(uVar1) {
    case 0x6e:
      bVar8 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
      goto switchD_0021c858_caseD_6f;
    case 0x72:
      bVar8 = 0xd;
      break;
    case 0x74:
      bVar8 = 9;
      break;
    case 0x76:
      bVar8 = 0xb;
      break;
    case 0x78:
switchD_0021c858_caseD_78:
      iVar4 = isxdigit((int)(char)((byte *)source)[2]);
      if ((char)iVar4 != '\0') {
        iVar4 = 0;
        while( true ) {
          bVar8 = (byte)iVar4;
          iVar5 = isxdigit((int)(char)pbVar7[1]);
          if ((char)iVar5 == '\0') break;
          pbVar7 = pbVar7 + 1;
          iVar5 = hex_digit_to_int(*pbVar7);
          iVar4 = iVar4 * 0x10 + iVar5;
        }
        break;
      }
      goto switchD_0021c858_caseD_6f;
    default:
      if (((uVar1 != 0x22) && (uVar1 != 0x27)) && (uVar1 != 0x3f)) {
        if (uVar1 == 0x58) goto switchD_0021c858_caseD_78;
        if (uVar1 != 0x5c) {
          if (uVar1 == 0x61) {
            bVar8 = 7;
          }
          else if (uVar1 == 0x62) {
            bVar8 = 8;
          }
          else {
            if (uVar1 != 0x66) {
              if (uVar1 != 0) goto switchD_0021c858_caseD_6f;
              goto LAB_0021c8d6;
            }
            bVar8 = 0xc;
          }
        }
      }
    }
LAB_0021c8b4:
    *pbVar9 = bVar8;
    pbVar9 = pbVar9 + 1;
switchD_0021c858_caseD_6f:
    source = (char *)(pbVar7 + 1);
  } while( true );
}

Assistant:

int UnescapeCEscapeSequences(const char* source, char* dest,
                             vector<string> *errors) {
  GOOGLE_DCHECK(errors == NULL) << "Error reporting not implemented.";

  char* d = dest;
  const char* p = source;

  // Small optimization for case where source = dest and there's no escaping
  while ( p == d && *p != '\0' && *p != '\\' )
    p++, d++;

  while (*p != '\0') {
    if (*p != '\\') {
      *d++ = *p++;
    } else {
      switch ( *++p ) {                    // skip past the '\\'
        case '\0':
          LOG_STRING(ERROR, errors) << "String cannot end with \\";
          *d = '\0';
          return d - dest;   // we're done with p
        case 'a':  *d++ = '\a';  break;
        case 'b':  *d++ = '\b';  break;
        case 'f':  *d++ = '\f';  break;
        case 'n':  *d++ = '\n';  break;
        case 'r':  *d++ = '\r';  break;
        case 't':  *d++ = '\t';  break;
        case 'v':  *d++ = '\v';  break;
        case '\\': *d++ = '\\';  break;
        case '?':  *d++ = '\?';  break;    // \?  Who knew?
        case '\'': *d++ = '\'';  break;
        case '"':  *d++ = '\"';  break;
        case '0': case '1': case '2': case '3':  // octal digit: 1 to 3 digits
        case '4': case '5': case '6': case '7': {
          char ch = *p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )
            ch = ch * 8 + *++p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )      // safe (and easy) to do this twice
            ch = ch * 8 + *++p - '0';      // now points at last digit
          *d++ = ch;
          break;
        }
        case 'x': case 'X': {
          if (!isxdigit(p[1])) {
            if (p[1] == '\0') {
              LOG_STRING(ERROR, errors) << "String cannot end with \\x";
            } else {
              LOG_STRING(ERROR, errors) <<
                "\\x cannot be followed by non-hex digit: \\" << *p << p[1];
            }
            break;
          }
          unsigned int ch = 0;
          const char *hex_start = p;
          while (isxdigit(p[1]))  // arbitrarily many hex digits
            ch = (ch << 4) + hex_digit_to_int(*++p);
          if (ch > 0xFF)
            LOG_STRING(ERROR, errors) << "Value of " <<
              "\\" << string(hex_start, p+1-hex_start) << " exceeds 8 bits";
          *d++ = ch;
          break;
        }
#if 0  // TODO(kenton):  Support \u and \U?  Requires runetochar().
        case 'u': {
          // \uhhhh => convert 4 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 4; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              rune = (rune << 4) + hex_digit_to_int(*++p);  // Advance p.
            } else {
              LOG_STRING(ERROR, errors)
                << "\\u must be followed by 4 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
        case 'U': {
          // \Uhhhhhhhh => convert 8 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 8; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              // Don't change rune until we're sure this
              // is within the Unicode limit, but do advance p.
              char32 newrune = (rune << 4) + hex_digit_to_int(*++p);
              if (newrune > 0x10FFFF) {
                LOG_STRING(ERROR, errors)
                  << "Value of \\"
                  << string(hex_start, p + 1 - hex_start)
                  << " exceeds Unicode limit (0x10FFFF)";
                break;
              } else {
                rune = newrune;
              }
            } else {
              LOG_STRING(ERROR, errors)
                << "\\U must be followed by 8 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
#endif
        default:
          LOG_STRING(ERROR, errors) << "Unknown escape sequence: \\" << *p;
      }
      p++;                                 // read past letter we escaped
    }
  }
  *d = '\0';
  return d - dest;
}